

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_2ddrawer.cpp
# Opt level: O3

void __thiscall
F2DDrawer::AddLine(F2DDrawer *this,int x1,int y1,int x2,int y2,int palcolor,uint32 color)

{
  FSimpleVertex *pFVar1;
  uchar *puVar2;
  int *piVar3;
  uint uVar4;
  FSimpleVertex *pFVar5;
  uchar *puVar6;
  uint uVar7;
  
  if (color == 0) {
    color = GPalette.BaseColors[palcolor].field_0.d;
  }
  TArray<FSimpleVertex,_FSimpleVertex>::Grow(&this->mVertices,2);
  uVar4 = (this->mVertices).Count;
  (this->mVertices).Count = uVar4 + 2;
  pFVar5 = (this->mVertices).Array;
  uVar7 = color >> 0x10 & 0xff | color & 0xff00 | color << 0x10 | 0xff000000;
  pFVar1 = pFVar5 + (int)uVar4;
  pFVar1->x = (float)x1;
  pFVar1->z = (float)y1;
  pFVar1->y = 0.0;
  pFVar1->u = 0.0;
  pFVar5[(int)uVar4].v = 0.0;
  pFVar5[(int)uVar4].color.field_0.d = uVar7;
  pFVar5 = (this->mVertices).Array;
  pFVar1 = pFVar5 + (long)(int)uVar4 + 1;
  pFVar1->x = (float)x2;
  pFVar1->z = (float)y2;
  pFVar1->y = 0.0;
  pFVar1->u = 0.0;
  pFVar5[(long)(int)uVar4 + 1].v = 0.0;
  pFVar5[(long)(int)uVar4 + 1].color.field_0.d = uVar7;
  if ((long)this->mLastLineCmd == -1) {
    TArray<unsigned_char,_unsigned_char>::Grow(&this->mData,0x10);
    uVar7 = (this->mData).Count;
    (this->mData).Count = uVar7 + 0x10;
    puVar6 = (this->mData).Array;
    puVar2 = puVar6 + (int)uVar7;
    puVar2[0] = '\x04';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar2[4] = '\x10';
    puVar2[5] = '\0';
    puVar2[6] = '\0';
    puVar2[7] = '\0';
    *(uint *)(puVar6 + (long)(int)uVar7 + 8) = uVar4;
    puVar6 = puVar6 + (long)(int)uVar7 + 0xc;
    puVar6[0] = '\x02';
    puVar6[1] = '\0';
    puVar6[2] = '\0';
    puVar6[3] = '\0';
    this->mLastLineCmd = uVar7;
  }
  else {
    piVar3 = (int *)((this->mData).Array + (long)this->mLastLineCmd + 0xc);
    *piVar3 = *piVar3 + 2;
  }
  return;
}

Assistant:

void F2DDrawer::AddLine(int x1, int y1, int x2, int y2, int palcolor, uint32 color)
{
	PalEntry p = color ? (PalEntry)color : GPalette.BaseColors[palcolor];
	p.a = 255;
	std::swap(p.r, p.b);

	DataGeneric dg;

	dg.mType = DrawTypeLine;
	dg.mLen = (sizeof(dg) + 7) & ~7;
	dg.mVertCount = 2;
	dg.mVertIndex = (int)mVertices.Reserve(2);
	mVertices[dg.mVertIndex].Set(x1, y1, 0, 0, 0, p);
	mVertices[dg.mVertIndex+1].Set(x2, y2, 0, 0, 0, p);

	// Test if we can batch multiple line commands
	if (mLastLineCmd == -1)
	{
		mLastLineCmd = AddData(&dg);
	}
	else
	{
		DataGeneric *dg = (DataGeneric *)&mData[mLastLineCmd];
		dg->mVertCount += 2;
	}
}